

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringlib.c
# Opt level: O1

int stringlib_isInteger(char *str)

{
  int iVar1;
  char cVar2;
  char *ptr;
  char *pcVar3;
  
  iVar1 = 0;
  if (*str != '\0') {
    cVar2 = *str;
    if (cVar2 != '\0') {
      pcVar3 = str + 1;
      do {
        if (cVar2 != '.' && 9 < (byte)(cVar2 - 0x30U)) {
          return 0;
        }
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar2 != '\0');
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int stringlib_isInteger(char *str) {
	char *ptr = str;

	if ( *ptr == '\0' ) {
		return 0;
	}

	while ( *ptr != '\0' ) {
		if ( ( *ptr < 48 || *ptr > 57 ) && *ptr != '.' ) {
			return 0;
		}
		ptr++;
	}
	return 1;
}